

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O3

double util::rpn_eval_not(vector<double,_std::allocator<double>_> *args)

{
  double dVar1;
  
  dVar1 = floor(*(args->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + 0.5);
  if ((int)dVar1 == 0) {
    dVar1 = 1.0;
  }
  else {
    dVar1 = 0.0;
  }
  return dVar1;
}

Assistant:

static double rpn_eval_not(std::vector<double> args)   { return !d2i(args[0]); }